

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack7_16(uint32_t *in,uint32_t *out)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  auVar4 = vpbroadcastd_avx512vl();
  uVar1 = *(ulong *)(in + 1);
  uVar5 = (uint)uVar1;
  auVar6._4_4_ = uVar5;
  auVar6._0_4_ = uVar5;
  auVar6._8_4_ = uVar5;
  auVar6._12_4_ = uVar5;
  auVar6 = vpinsrd_avx(auVar6,*in,0);
  auVar2 = vpsrlvd_avx2(auVar4,_DAT_001a8e70);
  auVar4 = vpinsrd_avx(auVar4,*in >> 7,1);
  auVar4 = vpunpcklqdq_avx(auVar4,auVar2);
  auVar7._8_4_ = 0x7f;
  auVar7._0_8_ = 0x7f0000007f;
  auVar7._12_4_ = 0x7f;
  auVar4 = vpand_avx(auVar4,auVar7);
  *(undefined1 (*) [16])out = auVar4;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar1;
  auVar2 = vpshufd_avx(auVar4,0x54);
  auVar4 = vpshufd_avx(auVar6,0x54);
  auVar3 = vpsrlvd_avx2(auVar4,_DAT_001a8e80);
  auVar4 = vpinsrd_avx(auVar7,(uVar5 & 7) << 4,0);
  auVar6 = vpor_avx(auVar3,auVar4);
  auVar4 = vpand_avx(auVar3,auVar7);
  auVar4 = vpblendd_avx2(auVar4,auVar6,1);
  *(undefined1 (*) [16])(out + 4) = auVar4;
  out[8] = uVar5 >> 0x18 & 0x7f;
  auVar2 = vpsrlvd_avx2(auVar2,_DAT_001a8e90);
  uVar5 = (uint)(uVar1 >> 0x20);
  auVar4 = vpinsrd_avx(auVar7,uVar5 * 2 & 0x7e,0);
  auVar6 = vpor_avx(auVar2,auVar4);
  auVar4 = vpand_avx(auVar2,auVar7);
  auVar4 = vpblendd_avx2(auVar4,auVar6,1);
  *(undefined1 (*) [16])(out + 9) = auVar4;
  out[0xd] = uVar5 >> 0x1b;
  out[0xd] = uVar5 >> 0x1b | (in[3] & 3) << 5;
  auVar4 = vpbroadcastd_avx512vl();
  auVar4 = vpsrlvd_avx2(auVar4,_DAT_001ad3a0);
  auVar4 = vpand_avx(auVar4,auVar7);
  *(long *)(out + 0xe) = auVar4._0_8_;
  return in + 4;
}

Assistant:

const uint32_t *__fastunpack7_16(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 7);
  out++;
  *out = ((*in) >> 7) % (1U << 7);
  out++;
  *out = ((*in) >> 14) % (1U << 7);
  out++;
  *out = ((*in) >> 21) % (1U << 7);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 3)) << (7 - 3);
  out++;
  *out = ((*in) >> 3) % (1U << 7);
  out++;
  *out = ((*in) >> 10) % (1U << 7);
  out++;
  *out = ((*in) >> 17) % (1U << 7);
  out++;
  *out = ((*in) >> 24) % (1U << 7);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 6)) << (7 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 7);
  out++;
  *out = ((*in) >> 13) % (1U << 7);
  out++;
  *out = ((*in) >> 20) % (1U << 7);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 2)) << (7 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 7);
  out++;
  *out = ((*in) >> 9) % (1U << 7);
  out++;

  return in + 1;
}